

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  ImGuiWindow *this;
  ImGuiID id;
  ImVec2 *pIVar2;
  char *str;
  long lVar3;
  int rounding_corners;
  bool bVar4;
  float fVar5;
  float fVar6;
  ImRect bb;
  ImRect local_40;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  local_40 = GetWindowScrollbarRect(this,axis);
  if (axis == ImGuiAxis_X) {
    rounding_corners = (this->ScrollbarY ^ 1) * 8 + 4;
    pIVar2 = &(this->InnerRect).Max;
    lVar3 = 0;
  }
  else {
    bVar4 = (this->Flags & 0x401U) == 1;
    rounding_corners = (uint)bVar4 * 2 + 8;
    if (this->ScrollbarX != false) {
      rounding_corners = (uint)bVar4 * 2;
    }
    lVar3 = (long)axis;
    if (axis != ImGuiAxis_Y) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
      fVar5 = (&(this->InnerRect).Max.x)[lVar3];
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
      fVar5 = fVar5 - (&(this->InnerRect).Min.x)[lVar3];
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
      fVar6 = (&(this->ContentSize).x)[lVar3];
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
      fVar1 = (&(this->WindowPadding).x)[lVar3];
      fVar6 = fVar1 + fVar1 + fVar6;
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
      goto LAB_001d69d5;
    }
    pIVar2 = (ImVec2 *)(&(this->InnerRect).Max.x + lVar3);
    lVar3 = 1;
  }
  fVar5 = pIVar2->x - (&(this->InnerRect).Min.x)[lVar3];
  fVar6 = (&(this->WindowPadding).x)[lVar3];
  fVar6 = fVar6 + fVar6 + (&(this->ContentSize).x)[lVar3];
LAB_001d69d5:
  ScrollbarEx(&local_40,id,axis,&(this->Scroll).x + lVar3,fVar5,fVar6,rounding_corners);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawCornerFlags rounding_corners = 0;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawCornerFlags_BotLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawCornerFlags_TopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}